

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliloop.c
# Opt level: O0

void cli_main_loop(cliloop_pw_setup_t pw_setup,cliloop_pw_check_t pw_check,cliloop_continue_t cont,
                  void *ctx)

{
  int fd_00;
  _Bool _Var1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  bool bVar6;
  _Bool ran_callback;
  int rwx_1;
  int fd_2;
  size_t i;
  _Bool found_fd;
  long lStack_90;
  _Bool overflow;
  long ticks;
  unsigned_long then;
  ulong uStack_78;
  int fd_1;
  size_t fdcount;
  size_t sStack_68;
  int fd;
  size_t nfds;
  unsigned_long next;
  int local_50;
  int fdstate;
  int ret;
  int rwx;
  pollwrapper *pw;
  size_t fdsize;
  int *fdlist;
  unsigned_long now;
  void *ctx_local;
  cliloop_continue_t cont_local;
  cliloop_pw_check_t pw_check_local;
  cliloop_pw_setup_t pw_setup_local;
  
  now = (unsigned_long)ctx;
  ctx_local = cont;
  cont_local = (cliloop_continue_t)pw_check;
  pw_check_local = (cliloop_pw_check_t)pw_setup;
  fdlist = (int *)getticks();
  fdsize = 0;
  pw = (pollwrapper *)0x0;
  _ret = pollwrap_new();
  do {
    do {
      pollwrap_clear(_ret);
      uVar3 = (*pw_check_local)((void *)now,_ret);
      if ((uVar3 & 1) == 0) goto LAB_001186d6;
      sStack_68 = 0;
      fdcount._4_4_ = first_fd((int *)((long)&next + 4),&fdstate);
      while (-1 < fdcount._4_4_) {
        sStack_68 = sStack_68 + 1;
        fdcount._4_4_ = next_fd((int *)((long)&next + 4),&fdstate);
      }
      fdsize = (size_t)safegrowarray((void *)fdsize,(size_t *)&pw,4,sStack_68,1,false);
      uStack_78 = 0;
      then._4_4_ = first_fd((int *)((long)&next + 4),&fdstate);
      while (-1 < then._4_4_) {
        *(int *)(fdsize + uStack_78 * 4) = then._4_4_;
        pollwrap_add_fd_rwx(_ret,then._4_4_,fdstate);
        then._4_4_ = next_fd((int *)((long)&next + 4),&fdstate);
        uStack_78 = uStack_78 + 1;
      }
      _Var1 = toplevel_callback_pending();
      if (_Var1) {
        local_50 = pollwrap_poll_instant(_ret);
        uVar5 = extraout_RDX;
      }
      else {
        _Var1 = run_timers((unsigned_long)fdlist,&nfds);
        if (_Var1) {
          do {
            piVar4 = fdlist;
            fdlist = (int *)getticks();
            if (nfds - (long)piVar4 < (ulong)((long)fdlist - (long)piVar4)) {
              lStack_90 = 0;
            }
            else {
              lStack_90 = nfds - (long)fdlist;
            }
            bVar6 = 0x7fffffff < lStack_90;
            if (bVar6) {
              lStack_90 = 0x7fffffff;
            }
            local_50 = pollwrap_poll_timeout(_ret,(int)lStack_90);
            if ((local_50 != 0) || (bVar6)) {
              fdlist = (int *)getticks();
              uVar5 = extraout_RDX_01;
            }
            else {
              fdlist = (int *)nfds;
              uVar5 = extraout_RDX_00;
            }
            bVar6 = false;
            if (local_50 < 0) {
              piVar4 = __errno_location();
              bVar6 = *piVar4 == 4;
              uVar5 = extraout_RDX_02;
            }
          } while (bVar6);
        }
        else {
          local_50 = pollwrap_poll_endless(_ret);
          uVar5 = extraout_RDX_03;
        }
      }
    } while ((local_50 < 0) && (piVar4 = __errno_location(), uVar5 = extraout_RDX_04, *piVar4 == 4))
    ;
    if (local_50 < 0) {
      perror("poll");
      exit(1);
    }
    bVar6 = 0 < local_50;
    for (_rwx_1 = 0; _rwx_1 < uStack_78; _rwx_1 = _rwx_1 + 1) {
      fd_00 = *(int *)(fdsize + _rwx_1 * 4);
      uVar2 = pollwrap_get_fd_rwx(_ret,fd_00);
      uVar5 = extraout_RDX_05;
      if ((uVar2 & 4) != 0) {
        select_result(fd_00,4);
        uVar5 = extraout_RDX_06;
      }
      if ((uVar2 & 1) != 0) {
        select_result(fd_00,1);
        uVar5 = extraout_RDX_07;
      }
      if ((uVar2 & 2) != 0) {
        select_result(fd_00,2);
        uVar5 = extraout_RDX_08;
      }
    }
    (*cont_local)((void *)now,SUB81(_ret,0),SUB81(uVar5,0));
    _Var1 = run_toplevel_callbacks();
    uVar3 = (*(code *)ctx_local)(now,bVar6,_Var1);
  } while ((uVar3 & 1) != 0);
LAB_001186d6:
  pollwrap_free(_ret);
  safefree((void *)fdsize);
  return;
}

Assistant:

void cli_main_loop(cliloop_pw_setup_t pw_setup,
                   cliloop_pw_check_t pw_check,
                   cliloop_continue_t cont, void *ctx)
{
    unsigned long now = GETTICKCOUNT();

    int *fdlist = NULL;
    size_t fdsize = 0;

    pollwrapper *pw = pollwrap_new();

    while (true) {
        int rwx;
        int ret;
        int fdstate;
        unsigned long next;

        pollwrap_clear(pw);

        if (!pw_setup(ctx, pw))
            break; /* our client signalled emergency exit */

        /* Count the currently active fds. */
        size_t nfds = 0;
        for (int fd = first_fd(&fdstate, &rwx); fd >= 0;
             fd = next_fd(&fdstate, &rwx))
            nfds++;

        /* Expand the fdlist buffer if necessary. */
        sgrowarray(fdlist, fdsize, nfds);

        /*
         * Add all currently open uxsel fds to pw, and store them in
         * fdlist as well.
         */
        size_t fdcount = 0;
        for (int fd = first_fd(&fdstate, &rwx); fd >= 0;
             fd = next_fd(&fdstate, &rwx)) {
            fdlist[fdcount++] = fd;
            pollwrap_add_fd_rwx(pw, fd, rwx);
        }

        if (toplevel_callback_pending()) {
            ret = pollwrap_poll_instant(pw);
        } else if (run_timers(now, &next)) {
            do {
                unsigned long then;
                long ticks;

                then = now;
                now = GETTICKCOUNT();
                if (now - then > next - then)
                    ticks = 0;
                else
                    ticks = next - now;

                bool overflow = false;
                if (ticks > INT_MAX) {
                    ticks = INT_MAX;
                    overflow = true;
                }

                ret = pollwrap_poll_timeout(pw, ticks);
                if (ret == 0 && !overflow)
                    now = next;
                else
                    now = GETTICKCOUNT();
            } while (ret < 0 && errno == EINTR);
        } else {
            ret = pollwrap_poll_endless(pw);
        }

        if (ret < 0 && errno == EINTR)
            continue;

        if (ret < 0) {
            perror("poll");
            exit(1);
        }

        bool found_fd = (ret > 0);

        for (size_t i = 0; i < fdcount; i++) {
            int fd = fdlist[i];
            int rwx = pollwrap_get_fd_rwx(pw, fd);
            /*
             * We must process exceptional notifications before
             * ordinary readability ones, or we may go straight
             * past the urgent marker.
             */
            if (rwx & SELECT_X)
                select_result(fd, SELECT_X);
            if (rwx & SELECT_R)
                select_result(fd, SELECT_R);
            if (rwx & SELECT_W)
                select_result(fd, SELECT_W);
        }

        pw_check(ctx, pw);

        bool ran_callback = run_toplevel_callbacks();

        if (!cont(ctx, found_fd, ran_callback))
            break;
    }

    pollwrap_free(pw);
    sfree(fdlist);
}